

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O0

char * do_pathnormalize(char *from,char *to)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcStack_28;
  char c;
  char *wp;
  char *rp;
  char *to_local;
  char *from_local;
  
  sys_unbashfilename(from,to);
  pcStack_28 = to;
  wp = to;
  while( true ) {
    cVar1 = *wp;
    pcVar4 = pcStack_28 + 1;
    *pcStack_28 = cVar1;
    pcVar3 = wp + 1;
    wp = wp + 1;
    if (cVar1 == '\0') break;
    while (pcVar2 = pcVar3, pcStack_28 = pcVar4, cVar1 == '/') {
      pcVar3 = pcVar2 + 1;
      wp = pcVar2;
      cVar1 = *pcVar2;
    }
  }
  return to;
}

Assistant:

static char*do_pathnormalize(const char *from, char *to) {
    const char *rp;
    char *wp, c;
    sys_unbashfilename(from, to);
    rp=wp=to;
    while((*wp++=c=*rp++)) {
        if('/' == c) {
            while('/' == *rp++);
            rp--;
        }
    }
    return to;
}